

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MORE_GTEST_MACROS.hh
# Opt level: O2

AssertionResult
FUNCTION_COMPARE_VEC_EQ<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
          (string *ref_name,vector<double,_std::allocator<double>_> *ref,string *test_name,
          vector<double,_std::allocator<double>_> *test)

{
  double *pdVar1;
  double dVar2;
  pointer pcVar3;
  ostream *poVar4;
  AssertionResult *pAVar5;
  ulong uVar6;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  long *in_R8;
  bool bVar9;
  AssertionResult AVar10;
  stringstream msg;
  AssertionResult local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar9 = test_name->_M_string_length - (long)(test_name->_M_dataplus)._M_p == in_R8[1] - *in_R8;
  if (!bVar9) {
    poVar4 = std::operator<<(local_1a8,"vector sizes not equal:\n");
    poVar4 = std::operator<<(poVar4," reference vector, ");
    poVar4 = std::operator<<(poVar4,(string *)ref);
    poVar4 = std::operator<<(poVar4,".size()=");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4," test vector, ");
    poVar4 = std::operator<<(poVar4,(string *)test);
    poVar4 = std::operator<<(poVar4,".size()=");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,"\n");
  }
  uVar7 = 0;
  while( true ) {
    pcVar3 = (test_name->_M_dataplus)._M_p;
    uVar6 = (long)(test_name->_M_string_length - (long)pcVar3) >> 3;
    uVar8 = in_R8[1] - *in_R8 >> 3;
    if (uVar6 <= uVar8) {
      uVar8 = uVar6;
    }
    if (uVar8 <= uVar7) break;
    dVar2 = *(double *)(pcVar3 + uVar7 * 8);
    pdVar1 = (double *)(*in_R8 + uVar7 * 8);
    if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
      poVar4 = std::operator<<(local_1a8,"vector element ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," not equal:\n");
      poVar4 = std::operator<<(poVar4," reference, ");
      poVar4 = std::operator<<(poVar4,(string *)ref);
      poVar4 = std::operator<<(poVar4,"[");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,"]=");
      poVar4 = std::ostream::_M_insert<double>
                         (*(double *)((test_name->_M_dataplus)._M_p + uVar7 * 8));
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4," test, ");
      poVar4 = std::operator<<(poVar4,(string *)test);
      poVar4 = std::operator<<(poVar4,"[");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,"]=");
      poVar4 = std::ostream::_M_insert<double>(*(double *)(*in_R8 + uVar7 * 8));
      std::operator<<(poVar4,"\n");
      bVar9 = false;
    }
    uVar7 = uVar7 + 1;
  }
  if (bVar9) {
    testing::AssertionSuccess();
  }
  else {
    testing::AssertionFailure();
    pAVar5 = testing::AssertionResult::operator<<(&local_1e8,(char (*) [2])0x13ed65);
    std::__cxx11::stringbuf::str();
    pAVar5 = testing::AssertionResult::operator<<(pAVar5,&local_1d8);
    testing::AssertionResult::AssertionResult((AssertionResult *)ref_name,pAVar5);
    std::__cxx11::string::~string((string *)&local_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&local_1e8.message_);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  AVar10.message_.ptr_ = extraout_RDX.ptr_;
  AVar10._0_8_ = ref_name;
  return AVar10;
}

Assistant:

inline
::testing::AssertionResult FUNCTION_COMPARE_VEC_EQ(const std::string& ref_name, const T1& ref, const std::string& test_name, const T2& test) {
    std::stringstream msg;
    bool pass = true;

    //test sizes first
    if( ref.size() != test.size() )
    {
        pass=false;
        msg << "vector sizes not equal:\n"<<
               " reference vector, "<<ref_name<<".size()="<<ref.size()<<"\n"<<
               " test vector, "<<test_name<<".size()="<<test.size()<<"\n";
    }

    //test any elements we can
    for( size_t i=0; i<MIN_SIZE_INTEGER(ref.size(),test.size()); ++i)
    {
        //use equality operator == instead of != to catch more custom comparison
        //operators that may not have != implemented
        if( !( ref[i] == test[i] ) )
        {
            pass=false;
            msg<<"vector element "<<i<<" not equal:\n"<<
               " reference, "<<ref_name<<"["<<i<<"]="<<ref[i]<<"\n"<<
               " test, "<<test_name<<"["<<i<<"]="<<test[i]<<"\n";
        }
    }

    if( pass )return ::testing::AssertionSuccess();

    return ::testing::AssertionFailure() << "\n"<<msg.str();
}